

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

void __thiscall
CharConvByte::unpack(CharConvByte *this,vm_val_t *val,CVmDataSource *src,int cnt,char pad)

{
  vm_obj_id_t obj;
  unsigned_long uVar1;
  int in_ECX;
  vm_val_t *in_RSI;
  CVmObjByteArray *arr;
  undefined3 in_stack_00000018;
  CVmObjByteArray *in_stack_00000038;
  unsigned_long in_stack_ffffffffffffffc8;
  vm_val_t *this_00;
  
  this_00 = in_RSI;
  obj = CVmObjByteArray::create((int)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffffc8);
  vm_val_t::set_obj(this_00,obj);
  vm_objp(0);
  CVmStack::push(in_RSI);
  uVar1 = CVmObjByteArray::read_from_file
                    (in_stack_00000038,this._4_4_,(CVmDataSource *)val,(unsigned_long)src,
                     CONCAT44(cnt,_in_stack_00000018),arr._4_4_);
  if ((int)uVar1 != in_ECX) {
    err_throw(0);
  }
  CVmStack::discard();
  return;
}

Assistant:

virtual void unpack(VMG_ vm_val_t *val, CVmDataSource *src, int cnt,
                        char pad)
    {
        /*
         *   For the byte type, we unpack into a ByteArray object rather than
         *   a string, and we leave any padding intact.  Create a byte array
         *   with the required size (and push it for gc protection).  
         */
        val->set_obj(CVmObjByteArray::create(vmg_ FALSE, cnt));
        CVmObjByteArray *arr = (CVmObjByteArray *)vm_objp(vmg_ val->val.obj);
        G_stk->push(val);

        /* read the data (don't save undo, since it's a new object) */
        if ((int)arr->read_from_file(
            vmg_ val->val.obj, src, 1, cnt, FALSE) != cnt)
            err_throw(VMERR_READ_FILE);

        /* done with the gc protection */
        G_stk->discard();
    }